

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPMS_PCR_SELECTION_Marshal(TPMS_PCR_SELECTION *source,BYTE **buffer,INT32 *size)

{
  byte bVar1;
  int iVar2;
  
  UINT16_Marshal(&source->hash,buffer,size);
  if ((buffer != (BYTE **)0x0) &&
     ((size == (INT32 *)0x0 || (iVar2 = *size, *size = iVar2 + -1, 0 < iVar2)))) {
    **buffer = source->sizeofSelect;
    *buffer = *buffer + 1;
  }
  bVar1 = source->sizeofSelect;
  if ((buffer != (BYTE **)0x0) &&
     ((size == (INT32 *)0x0 || (*size = *size - (uint)bVar1, -1 < *size)))) {
    memcpy(*buffer,source->pcrSelect,(ulong)bVar1);
    *buffer = *buffer + bVar1;
  }
  return bVar1 + 3;
}

Assistant:

UINT16
TPMS_PCR_SELECTION_Marshal(TPMS_PCR_SELECTION *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + TPMI_ALG_HASH_Marshal((TPMI_ALG_HASH *)&(source->hash), buffer, size));
    result = (UINT16)(result + UINT8_Marshal((UINT8 *)&(source->sizeofSelect), buffer, size));
    result = (UINT16)(result + BYTE_Array_Marshal((BYTE *)(source->pcrSelect), buffer, size, (INT32)(source->sizeofSelect)));
    return result;
}